

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall
Assimp::AMFImporter::XML_CheckNode_SkipUnsupported(AMFImporter *this,string *pParentNodeName)

{
  int iVar1;
  undefined4 extraout_var;
  Logger *this_00;
  long *extraout_RAX;
  long *plVar2;
  _Base_ptr in_RCX;
  ProgressHandler **ppPVar3;
  _Base_ptr extraout_RDX;
  _Base_ptr p_Var4;
  bool bVar5;
  AMFImporter *this_01;
  ulong uVar6;
  bool bVar7;
  string nn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  ProgressHandler *local_198;
  CAMFImporter_NodeElement *pCStack_190;
  ios_base local_138 [264];
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,(char *)CONCAT44(extraout_var,iVar1),
             (allocator<char> *)local_1a8._M_local_buf);
  bVar7 = true;
  uVar6 = 0;
  bVar5 = false;
  do {
    this_01 = (AMFImporter *)local_208;
    iVar1 = std::__cxx11::string::compare((char *)local_208);
    if (iVar1 == 0) {
      this_01 = (AMFImporter *)this->mReader;
      iVar1 = (*(this_01->super_BaseImporter)._vptr_BaseImporter[0xf])();
      if ((char)iVar1 != '\0') {
LAB_003eb7f9:
        bVar5 = true;
        goto LAB_003eb7fb;
      }
      while( true ) {
        this_01 = (AMFImporter *)this->mReader;
        iVar1 = (*(this_01->super_BaseImporter)._vptr_BaseImporter[2])();
        if ((char)iVar1 == '\0') break;
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar1 == 2) {
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          this_01 = (AMFImporter *)local_208;
          iVar1 = std::__cxx11::string::compare((char *)local_208);
          if (iVar1 == 0) goto LAB_003eb7f9;
        }
      }
      bVar5 = true;
    }
    bVar7 = uVar6 < 2;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 3);
  uVar6 = 3;
LAB_003eb7fb:
  if (bVar5) {
    if (bVar7) {
      if (XML_CheckNode_SkipUnsupported::skipped_before[uVar6] == false) {
        XML_CheckNode_SkipUnsupported::skipped_before[uVar6] = true;
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[16]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_1a8,(char (*) [16])"Skipping node \"");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8._M_local_buf,(char *)local_208._0_8_,local_208._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8._M_local_buf,"\" in ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8._M_local_buf,(pParentNodeName->_M_dataplus)._M_p,
                   pParentNodeName->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8._M_local_buf,".",1);
        std::__cxx11::stringbuf::str();
        Logger::warn(this_00,local_228._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
        std::ios_base::~ios_base(local_138);
      }
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
      }
      return;
    }
    Throw_CloseNotFound(this_01,(string *)local_208);
    plVar2 = extraout_RAX;
    p_Var4 = extraout_RDX;
  }
  else {
    this = (AMFImporter *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1c8,"Unknown node \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_1e8._0_8_ = local_1e8 + 0x10;
    p_Var4 = (_Base_ptr)*plVar2;
    in_RCX = (_Base_ptr)(plVar2 + 2);
    if (p_Var4 == in_RCX) {
      local_1e8._16_8_ = *(undefined8 *)in_RCX;
      local_1e8._24_8_ = plVar2[3];
      goto LAB_003eb997;
    }
  }
  local_1e8._16_8_ = *(undefined8 *)in_RCX;
  local_1e8._0_8_ = p_Var4;
LAB_003eb997:
  local_1e8._8_8_ = plVar2[1];
  *plVar2 = (long)in_RCX;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 pParentNodeName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_1a8._M_allocated_capacity = *plVar2;
  ppPVar3 = (ProgressHandler **)(plVar2 + 2);
  if ((ProgressHandler **)local_1a8._M_allocated_capacity == ppPVar3) {
    local_198 = *ppPVar3;
    pCStack_190 = (CAMFImporter_NodeElement *)plVar2[3];
    local_1a8._M_allocated_capacity = (size_type)&local_198;
  }
  else {
    local_198 = *ppPVar3;
  }
  local_1a8._8_8_ = plVar2[1];
  *plVar2 = (long)ppPVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)this,(string *)local_1a8._M_local_buf);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR__runtime_error_0082bce0;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::XML_CheckNode_SkipUnsupported(const std::string& pParentNodeName)
{
    static const size_t Uns_Skip_Len = 3;
    const char* Uns_Skip[Uns_Skip_Len] = { "composite", "edge", "normal" };

    static bool skipped_before[Uns_Skip_Len] = { false, false, false };

    std::string nn(mReader->getNodeName());
    bool found = false;
    bool close_found = false;
    size_t sk_idx;

	for(sk_idx = 0; sk_idx < Uns_Skip_Len; sk_idx++)
	{
		if(nn != Uns_Skip[sk_idx]) continue;

		found = true;
		if(mReader->isEmptyElement())
		{
			close_found = true;

			goto casu_cres;
		}

		while(mReader->read())
		{
			if((mReader->getNodeType() == irr::io::EXN_ELEMENT_END) && (nn == mReader->getNodeName()))
			{
				close_found = true;

				goto casu_cres;
			}
		}
	}// for(sk_idx = 0; sk_idx < Uns_Skip_Len; sk_idx++)

casu_cres:

	if(!found) throw DeadlyImportError("Unknown node \"" + nn + "\" in " + pParentNodeName + ".");
	if(!close_found) Throw_CloseNotFound(nn);

	if(!skipped_before[sk_idx])
	{
		skipped_before[sk_idx] = true;
        ASSIMP_LOG_WARN_F("Skipping node \"", nn, "\" in ", pParentNodeName, ".");
	}
}